

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O1

void __thiscall
Js::ScriptContext::RecordFieldAccessStats
          (ScriptContext *this,FunctionBody *functionBody,FieldAccessStatsPtr fieldAccessStats)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Recycler *pRVar4;
  FieldAccessStatsPtr this_00;
  undefined1 local_68 [8];
  TrackAllocData data;
  FieldAccessStatsPtr fieldAccessStats_local;
  FieldAccessStatsEntry *entry;
  RecyclerWeakReference<Js::FunctionBody> *functionBodyWeakRef;
  
  data._32_8_ = fieldAccessStats;
  if (fieldAccessStats == (FieldAccessStatsPtr)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                ,0x19a5,"(fieldAccessStats != nullptr)",
                                "fieldAccessStats != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  bVar2 = Phases::IsEnabled((Phases *)&DAT_015ca868,ObjTypeSpecPhase);
  if (bVar2) {
    local_68._0_4_ =
         (functionBody->super_ParseableFunctionInfo).super_FunctionProxy.m_functionNumber;
    bVar2 = JsUtil::
            BaseDictionary<unsigned_int,_Js::ScriptContext::FieldAccessStatsEntry_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::TryGetValue<unsigned_int>
                      (this->fieldAccessStatsByFunctionNumber,(uint *)local_68,
                       (FieldAccessStatsEntry **)&fieldAccessStats_local);
    if (!bVar2) {
      pRVar4 = this->recycler;
      bVar2 = Memory::WeakReferenceHashTable<PrimePolicy>::FindOrAdd
                        (&pRVar4->weakReferenceMap,(char *)functionBody,pRVar4,
                         (RecyclerWeakReferenceBase **)&entry);
      if (!bVar2) {
        entry[1].functionBodyWeakRef.ptr =
             (RecyclerWeakReference<Js::FunctionBody> *)&FunctionBody::typeinfo;
        Memory::Recycler::TrackAllocWeakRef(pRVar4,(RecyclerWeakReferenceBase *)entry);
      }
      local_68 = (undefined1  [8])&FieldAccessStatsEntry::typeinfo;
      data.typeinfo = (type_info *)0x0;
      data.plusSize = 0xffffffffffffffff;
      data.count = (size_t)anon_var_dwarf_2d86450;
      data.filename._0_4_ = 0x19b1;
      pRVar4 = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_68);
      this_00 = (FieldAccessStatsPtr)new<Memory::Recycler>(0x20,pRVar4,0x38bbb2);
      FieldAccessStatsEntry::FieldAccessStatsEntry
                ((FieldAccessStatsEntry *)this_00,(RecyclerWeakReference<Js::FunctionBody> *)entry,
                 this->recycler);
      local_68._0_4_ =
           (functionBody->super_ParseableFunctionInfo).super_FunctionProxy.m_functionNumber;
      fieldAccessStats_local = this_00;
      JsUtil::
      BaseDictionary<unsigned_int,Js::ScriptContext::FieldAccessStatsEntry*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
      ::
      Insert<(JsUtil::BaseDictionary<unsigned_int,Js::ScriptContext::FieldAccessStatsEntry*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)1>
                ((BaseDictionary<unsigned_int,Js::ScriptContext::FieldAccessStatsEntry*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                  *)this->fieldAccessStatsByFunctionNumber,(uint *)local_68,
                 (FieldAccessStatsEntry **)&fieldAccessStats_local);
    }
    SListBase<Js::FieldAccessStats_*,_Memory::Recycler,_RealCount>::Prepend
              ((SListBase<Js::FieldAccessStats_*,_Memory::Recycler,_RealCount> *)
               &fieldAccessStats_local->monoInlineCacheCount,
               *(Recycler **)&fieldAccessStats_local->emptyPolyInlineCacheCount,
               (FieldAccessStats **)&data.line);
  }
  return;
}

Assistant:

void ScriptContext::RecordFieldAccessStats(FunctionBody* functionBody, FieldAccessStatsPtr fieldAccessStats)
    {
        Assert(fieldAccessStats != nullptr);

        if (!PHASE_STATS1(Js::ObjTypeSpecPhase))
        {
            return;
        }

        FieldAccessStatsEntry* entry;
        if (!this->fieldAccessStatsByFunctionNumber->TryGetValue(functionBody->GetFunctionNumber(), &entry))
        {
            RecyclerWeakReference<FunctionBody>* functionBodyWeakRef;
            this->recycler->FindOrCreateWeakReferenceHandle(functionBody, &functionBodyWeakRef);
            entry = RecyclerNew(this->recycler, FieldAccessStatsEntry, functionBodyWeakRef, this->recycler);

            this->fieldAccessStatsByFunctionNumber->AddNew(functionBody->GetFunctionNumber(), entry);
        }

        entry->stats.Prepend(fieldAccessStats);
    }